

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeline.h
# Opt level: O0

void __thiscall CS248::Timeline::Timeline(Timeline *this)

{
  undefined4 *in_RDI;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0x180;
  in_RDI[3] = 0;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x24f0d7);
  *(undefined1 *)((long)in_RDI + 0x49) = 0;
  return;
}

Assistant:

Timeline() : x(0), y(0), w(64 * 6), h(0) { isLooping = false; }